

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# multi_ev.c
# Opt level: O3

CURLMcode mev_assess(Curl_multi *multi,Curl_easy *data,connectdata *conn)

{
  curl_trc_feat *pcVar1;
  bool bVar2;
  bool bVar3;
  Curl_hash *h;
  connectdata *pcVar4;
  _Bool _Var5;
  CURLcode CVar6;
  CURLMcode CVar7;
  uint uVar8;
  curl_socket_t *pcVar9;
  mev_sh_entry *pmVar10;
  void *pvVar11;
  connectdata *pcVar12;
  ulong uVar13;
  ulong uVar14;
  uint uVar15;
  char *pcVar16;
  easy_pollset *ps_1;
  mev_sh_entry *entry;
  uchar last_action;
  easy_pollset ps;
  uint local_84;
  ulong local_80;
  Curl_multi *local_78;
  uint local_6c;
  Curl_hash *local_68;
  curl_socket_t *local_60;
  easy_pollset local_58;
  connectdata *local_38;
  
  if (multi == (Curl_multi *)0x0) {
    return CURLM_OK;
  }
  if (multi->socket_cb == (curl_socket_callback)0x0) {
    return CURLM_OK;
  }
  local_58.sockets[4] = 0;
  local_58.num = 0;
  local_58.actions[0] = '\0';
  local_58.actions[1] = '\0';
  local_58.actions[2] = '\0';
  local_58.actions[3] = '\0';
  local_58.actions[4] = '\0';
  local_58._29_3_ = 0;
  local_58.sockets[0] = 0;
  local_58.sockets[1] = 0;
  local_58.sockets[2] = 0;
  local_58.sockets[3] = 0;
  if (conn == (connectdata *)0x0) {
    if (data != (Curl_easy *)0x0) {
      Curl_multi_getsock(data,&local_58,"ev assess");
      pcVar9 = (curl_socket_t *)Curl_meta_get(data,"meta:mev:ps");
      goto LAB_00149d71;
    }
  }
  else {
    Curl_conn_adjust_pollset(data,conn,&local_58);
    if (data != (Curl_easy *)0x0) {
      pcVar9 = (curl_socket_t *)Curl_conn_meta_get(conn,"meta:mev:ps");
LAB_00149d71:
      bVar3 = false;
      goto LAB_00149d87;
    }
  }
  bVar3 = true;
  pcVar9 = (curl_socket_t *)0x0;
LAB_00149d87:
  if (local_58.num == 0 || pcVar9 != (curl_socket_t *)0x0) {
    if (pcVar9 == (curl_socket_t *)0x0) {
      return CURLM_OK;
    }
  }
  else {
    pcVar9 = (curl_socket_t *)(*Curl_ccalloc)(1,0x20);
    if (conn == (connectdata *)0x0) {
      if (pcVar9 == (curl_socket_t *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      CVar6 = Curl_meta_set(data,"meta:mev:ps",pcVar9,mev_pollset_dtor);
    }
    else {
      if (pcVar9 == (curl_socket_t *)0x0) {
        return CURLM_OUT_OF_MEMORY;
      }
      CVar6 = Curl_conn_meta_set(conn,"meta:mev:ps",pcVar9,mev_pollset_dtor);
    }
    if (CVar6 != CURLE_OK) {
      return CURLM_OUT_OF_MEMORY;
    }
  }
  local_78 = multi;
  local_60 = pcVar9;
  if (local_58.num != 0) {
    local_68 = &(multi->ev).sh_entries;
    uVar14 = 0;
    local_38 = conn;
    do {
      pcVar4 = local_38;
      h = local_68;
      local_84 = local_58.sockets[uVar14];
      if (local_84 == 0xffffffff) {
        local_6c = 0xffffffff;
        uVar15 = 0xffffffff;
LAB_00149ea8:
        pmVar10 = (mev_sh_entry *)(*Curl_ccalloc)(1,0x50);
        if (pmVar10 == (mev_sh_entry *)0x0) {
          return CURLM_OUT_OF_MEMORY;
        }
        Curl_uint_spbset_init((uint_spbset *)pmVar10);
        pvVar11 = Curl_hash_add(local_68,&local_6c,4,pmVar10);
        if (pvVar11 == (void *)0x0) {
          Curl_uint_spbset_destroy((uint_spbset *)pmVar10);
          (*Curl_cfree)(pmVar10);
          return CURLM_OUT_OF_MEMORY;
        }
LAB_00149f19:
        if ((((!bVar3) && (((data->set).field_0x89f & 0x40) != 0)) &&
            ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 || (0 < pcVar1->log_level)
             ))) && (0 < Curl_trc_feat_multi.log_level)) {
          Curl_trc_multi(data,"ev new entry fd=%d",(ulong)uVar15);
        }
        if (pcVar4 == (connectdata *)0x0) {
LAB_00149fc5:
          _Var5 = Curl_uint_spbset_add(&pmVar10->xfers,data->mid);
          bVar2 = true;
          if (!_Var5) {
            return CURLM_OUT_OF_MEMORY;
          }
LAB_00149fdb:
          if (((data->set).field_0x89f & 0x40) == 0) goto LAB_00149fe5;
          pcVar1 = (data->state).feat;
          if (pcVar1 == (curl_trc_feat *)0x0) {
            if (Curl_trc_feat_multi.log_level < 1) goto LAB_00149fe5;
          }
          else {
            last_action = '\0';
            if ((pcVar1->log_level < 1) || (Curl_trc_feat_multi.log_level < 1)) goto LAB_0014a09f;
          }
          pcVar16 = "connection";
          if (bVar2) {
            pcVar16 = "transfer";
            local_80 = (ulong)data->mid;
          }
          else {
            local_80 = local_38->connection_id;
          }
          uVar8 = Curl_uint_spbset_count(&pmVar10->xfers);
          last_action = '\0';
          Curl_trc_multi(data,"ev entry fd=%d, added %s #%ld, total=%u/%d (xfer/conn)",(ulong)uVar15
                         ,pcVar16,local_80,(ulong)uVar8,(uint)(pmVar10->conn != (connectdata *)0x0))
          ;
        }
        else {
          pcVar12 = pmVar10->conn;
LAB_00149f65:
          if (pcVar12 != (connectdata *)0x0) {
            return CURLM_OUT_OF_MEMORY;
          }
          pmVar10->conn = pcVar4;
          bVar2 = false;
          last_action = '\0';
          if (!bVar3) goto LAB_00149fdb;
        }
      }
      else {
        local_80 = CONCAT44(local_80._4_4_,local_84);
        pmVar10 = (mev_sh_entry *)Curl_hash_pick(local_68,&local_84,4);
        uVar15 = (uint)local_80;
        if (pmVar10 == (mev_sh_entry *)0x0) {
          local_6c = (uint)local_80;
          local_84 = (uint)local_80;
          pmVar10 = (mev_sh_entry *)Curl_hash_pick(h,&local_84,4);
          if (pmVar10 == (mev_sh_entry *)0x0) goto LAB_00149ea8;
          goto LAB_00149f19;
        }
        if (pcVar4 == (connectdata *)0x0) {
          _Var5 = Curl_uint_spbset_contains((uint_spbset *)pmVar10,data->mid);
          if (_Var5) goto LAB_00149fa0;
          uVar15 = (uint)local_80;
          goto LAB_00149fc5;
        }
        pcVar12 = pmVar10->conn;
        if (pcVar12 != pcVar4) goto LAB_00149f65;
LAB_00149fa0:
        uVar15 = (uint)local_80;
        if ((ulong)(uint)local_60[5] != 0) {
          uVar13 = 0;
          do {
            if ((uint)local_80 == local_60[uVar13]) {
              last_action = *(uchar *)((long)local_60 + uVar13 + 0x18);
              goto LAB_0014a09f;
            }
            uVar13 = uVar13 + 1;
          } while ((uint)local_60[5] != uVar13);
        }
LAB_00149fe5:
        last_action = '\0';
      }
LAB_0014a09f:
      CVar7 = mev_sh_entry_update(local_78,data,pmVar10,uVar15,last_action,local_58.actions[uVar14])
      ;
      if (CVar7 != CURLM_OK) {
        return CVar7;
      }
      uVar14 = uVar14 + 1;
      conn = local_38;
    } while (uVar14 < (ulong)local_58._16_8_ >> 0x20);
  }
  pcVar9 = local_60;
  if (local_60[5] != 0) {
    local_68 = &(local_78->ev).sh_entries;
    uVar14 = 0;
    do {
      uVar15 = pcVar9[uVar14];
      if ((ulong)local_58._16_8_ >> 0x20 != 0) {
        uVar13 = 0;
        do {
          if (uVar15 == local_58.sockets[uVar13]) goto LAB_0014a2ff;
          uVar13 = uVar13 + 1;
        } while ((ulong)local_58._16_8_ >> 0x20 != uVar13);
      }
      if ((uVar15 != 0xffffffff) &&
         (local_84 = uVar15, pmVar10 = (mev_sh_entry *)Curl_hash_pick(local_68,&local_84,4),
         pmVar10 != (mev_sh_entry *)0x0)) {
        if (conn == (connectdata *)0x0) {
          _Var5 = Curl_uint_spbset_contains((uint_spbset *)pmVar10,data->mid);
          if (_Var5) {
            Curl_uint_spbset_remove((uint_spbset *)pmVar10,data->mid);
            goto LAB_0014a1eb;
          }
          if ((((data->set).field_0x89f & 0x40) != 0) &&
             (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
               (0 < pcVar1->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
            pcVar16 = "ev entry fd=%d, transfer lost interest but is not registered";
            goto LAB_0014a2f6;
          }
        }
        else if (pmVar10->conn == conn) {
          pmVar10->conn = (connectdata *)0x0;
LAB_0014a1eb:
          uVar8 = Curl_uint_spbset_count((uint_spbset *)pmVar10);
          if (uVar8 == -(uint)(pmVar10->conn != (connectdata *)0x0)) {
            CVar7 = mev_forget_socket(local_78,data,uVar15,"last user gone");
            if (CVar7 != CURLM_OK) {
              return CVar7;
            }
          }
          else {
            CVar7 = mev_sh_entry_update(local_78,data,pmVar10,uVar15,
                                        *(uchar *)((long)pcVar9 + uVar14 + 0x18),'\0');
            if (CVar7 != CURLM_OK) {
              return CVar7;
            }
            if ((((!bVar3) && (((data->set).field_0x89f & 0x40) != 0)) &&
                ((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                 (0 < pcVar1->log_level)))) && (0 < Curl_trc_feat_multi.log_level)) {
              uVar8 = Curl_uint_spbset_count((uint_spbset *)pmVar10);
              Curl_trc_multi(data,"ev entry fd=%d, removed transfer, total=%u/%d (xfer/conn)",
                             (ulong)uVar15,(ulong)uVar8,(ulong)(pmVar10->conn != (connectdata *)0x0)
                            );
            }
          }
        }
        else if (((!bVar3) && (((data->set).field_0x89f & 0x40) != 0)) &&
                (((pcVar1 = (data->state).feat, pcVar1 == (curl_trc_feat *)0x0 ||
                  (0 < pcVar1->log_level)) && (0 < Curl_trc_feat_multi.log_level)))) {
          pcVar16 = "ev entry fd=%d, conn lost interest but is not registered";
LAB_0014a2f6:
          Curl_trc_multi(data,pcVar16,(ulong)uVar15);
        }
      }
LAB_0014a2ff:
      uVar14 = uVar14 + 1;
    } while (uVar14 < (uint)pcVar9[5]);
  }
  *(undefined8 *)(pcVar9 + 4) = local_58._16_8_;
  *(undefined8 *)(pcVar9 + 6) = local_58._24_8_;
  *(undefined8 *)pcVar9 = local_58.sockets._0_8_;
  *(undefined8 *)(pcVar9 + 2) = local_58.sockets._8_8_;
  return CURLM_OK;
}

Assistant:

static CURLMcode mev_assess(struct Curl_multi *multi,
                            struct Curl_easy *data,
                            struct connectdata *conn)
{
  if(multi && multi->socket_cb) {
    struct easy_pollset ps, *last_ps;

    mev_init_cur_pollset(&ps, data, conn);
    last_ps = mev_get_last_pollset(data, conn);

    if(!last_ps && ps.num) {
      if(conn)
        last_ps = mev_add_new_conn_pollset(conn);
      else
        last_ps = mev_add_new_xfer_pollset(data);
      if(!last_ps)
        return CURLM_OUT_OF_MEMORY;
    }

    if(last_ps)
      return mev_pollset_diff(multi, data, conn, &ps, last_ps);
    else
      DEBUGASSERT(!ps.num);
  }
  return CURLM_OK;
}